

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_compare(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_DATA *obj;
  long in_RDI;
  __type_conflict2 _Var2;
  int value2;
  int value1;
  char *msg;
  OBJ_DATA *obj2;
  OBJ_DATA *obj1;
  char arg2 [4608];
  char arg1 [4608];
  char *in_stack_ffffffffffffdba8;
  undefined4 in_stack_ffffffffffffdbb0;
  int in_stack_ffffffffffffdbb4;
  CHAR_DATA *in_stack_ffffffffffffdbb8;
  char *in_stack_ffffffffffffdbc0;
  OBJ_DATA *local_2428;
  char in_stack_ffffffffffffdbe8;
  undefined1 uVar3;
  undefined7 in_stack_ffffffffffffdbe9;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  char *in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char local_1218;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
               in_stack_ffffffffffffdba8);
  one_argument((char *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
               in_stack_ffffffffffffdba8);
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
  }
  else {
    obj = get_obj_carry(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
                        in_stack_ffffffffffffedb8);
    if (obj == (OBJ_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
    }
    else {
      if (in_stack_ffffffffffffdbe8 == '\0') {
        uVar3 = 0;
        for (local_2428 = *(OBJ_DATA **)(in_RDI + 0x98); local_2428 != (OBJ_DATA *)0x0;
            local_2428 = local_2428->next_content) {
          if ((((local_2428->wear_loc != -1) &&
               (bVar1 = can_see_obj((CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,uVar3),obj),
               bVar1)) && (obj->item_type == local_2428->item_type)) &&
             (obj->wear_flags[0] == local_2428->wear_flags[0])) {
            in_stack_ffffffffffffdbc0 = (char *)obj->wear_flags[0];
            _Var2 = std::pow<int,int>(0,0x550ed8);
            if (((ulong)in_stack_ffffffffffffdbc0 & (long)_Var2) != 0) {
              in_stack_ffffffffffffdbb8 = (CHAR_DATA *)local_2428->wear_flags[0];
              _Var2 = std::pow<int,int>(0,0x550f08);
              if (((ulong)in_stack_ffffffffffffdbb8 & (long)_Var2) != 0) break;
            }
          }
        }
        if (local_2428 == (OBJ_DATA *)0x0) {
          send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
          return;
        }
      }
      else {
        local_2428 = get_obj_carry(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
                                   in_stack_ffffffffffffedb8);
        if (local_2428 == (OBJ_DATA *)0x0) {
          send_to_char(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
          return;
        }
      }
      if ((obj != local_2428) && (obj->item_type == local_2428->item_type)) {
        in_stack_ffffffffffffdbb4 = (int)obj->item_type;
      }
      act(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8,
          (void *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
          in_stack_ffffffffffffdba8,0);
    }
  }
  return;
}

Assistant:

void do_compare(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Compare what to what?\n\r", ch);
		return;
	}

	auto obj1 = get_obj_carry(ch, arg1, ch);
	if (obj1 == nullptr)
	{
		send_to_char("You do not have that item.\n\r", ch);
		return;
	}

	OBJ_DATA *obj2;
	if (arg2[0] == '\0')
	{
		for (obj2 = ch->carrying; obj2 != nullptr; obj2 = obj2->next_content)
		{
			if (obj2->wear_loc != WEAR_NONE 
				&& can_see_obj(ch, obj2) 
				&& obj1->item_type == obj2->item_type 
				&& obj1->wear_flags[0] == obj2->wear_flags[0]
				&& IS_SET(obj1->wear_flags, ITEM_TAKE)
				&& IS_SET(obj2->wear_flags, ITEM_TAKE))
			{
				break;
			}
		}

		if (obj2 == nullptr)
		{
			send_to_char("You aren't wearing anything comparable.\n\r", ch);
			return;
		}
	}
	else
	{
		obj2 = get_obj_carry(ch, arg2, ch);
		if (obj2 == nullptr)
		{
			send_to_char("You do not have that item.\n\r", ch);
			return;
		}
	}

	char *msg = nullptr;
	auto value1 = 0;
	auto value2 = 0;

	if (obj1 == obj2)
	{
		msg = "You compare $p to itself.  It looks about the same.";
	}
	else if (obj1->item_type != obj2->item_type)
	{
		msg = "You can't compare $p and $P.";
	}
	else
	{
		switch (obj1->item_type)
		{
			case ITEM_ARMOR:
				value1 = obj1->value[0] + obj1->value[1] + obj1->value[2];
				value2 = obj2->value[0] + obj2->value[1] + obj2->value[2];
				break;
			case ITEM_WEAPON:
				value1 = (1 + obj1->value[2]) * obj1->value[1];
				value2 = (1 + obj2->value[2]) * obj2->value[1];
				break;
			default:
				msg = "You can't compare $p and $P.";
				break;
		}
	}

	if (msg == nullptr)
	{
		if (value1 == value2)
			msg = "$p and $P look about the same.";
		else if (value1 > value2)
			msg = "$p looks better than $P.";
		else
			msg = "$p looks worse than $P.";
	}

	act(msg, ch, obj1, obj2, TO_CHAR);
}